

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageOrderModification.cpp
# Opt level: O0

EStatusCode
AddPageToNewTree(unsigned_long inPageIndex,PDFWriter *inWriter,
                PDFDocumentCopyingContext *inCopyingContext)

{
  iteratorType *this;
  DictionaryContext *pDVar1;
  EStatusCode EVar2;
  bool bVar3;
  DocumentContext *this_00;
  CatalogInformation *this_01;
  ObjectsContext *this_02;
  IndirectObjectsReferenceRegistry *inObjectsRegistry;
  PDFParser *this_03;
  ObjectIDType inPageID;
  ObjectIDType inObjectReference;
  PDFDictionary *pPVar4;
  key_type pPVar5;
  string *psVar6;
  mapped_type inObject;
  allocator<char> local_c1;
  string local_c0;
  DictionaryContext *local_a0;
  DictionaryContext *modifiedPageObject;
  ObjectsContext *pOStack_90;
  EStatusCode status;
  ObjectsContext *objectContext;
  undefined1 local_78 [8];
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  ObjectIDType newParent;
  ObjectIDType pageObjectId;
  PDFParser *modifiedFileParser;
  IndirectObjectsReferenceRegistry *objectsRegistry;
  CatalogInformation *catalogInformation;
  PDFDocumentCopyingContext *inCopyingContext_local;
  PDFWriter *inWriter_local;
  unsigned_long inPageIndex_local;
  
  this_00 = PDFWriter::GetDocumentContext(inWriter);
  this_01 = PDFHummus::DocumentContext::GetCatalogInformation(this_00);
  this_02 = PDFWriter::GetObjectsContext(inWriter);
  inObjectsRegistry = ObjectsContext::GetInDirectObjectsRegistry(this_02);
  this_03 = PDFWriter::GetModifiedFileParser(inWriter);
  inPageID = PDFParser::GetPageObjectID(this_03,inPageIndex);
  inObjectReference = CatalogInformation::AddPageToPageTree(this_01,inPageID,inObjectsRegistry);
  pPVar4 = PDFParser::ParsePage(this_03,inPageIndex);
  this = &pageDictionaryObjectIt.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition;
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)this,&pPVar4->super_PDFObject);
  pPVar4 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)this);
  PDFDictionary::GetIterator
            ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              *)local_78,pPVar4);
  pOStack_90 = PDFWriter::GetObjectsContext(inWriter);
  modifiedPageObject._4_4_ = ObjectsContext::StartModifiedIndirectObject(pOStack_90,inPageID);
  if (modifiedPageObject._4_4_ == eSuccess) {
    local_a0 = ObjectsContext::StartDictionary(pOStack_90);
    while (bVar3 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)local_78), pDVar1 = local_a0, bVar3) {
      pPVar5 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                         *)local_78);
      psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
      bVar3 = std::operator!=(psVar6,"Parent");
      pDVar1 = local_a0;
      if (bVar3) {
        pPVar5 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)local_78);
        psVar6 = PDFName::GetValue_abi_cxx11_(pPVar5);
        DictionaryContext::WriteKey(pDVar1,psVar6);
        inObject = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)local_78);
        PDFDocumentCopyingContext::CopyDirectObjectAsIs(inCopyingContext,inObject);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Parent",&local_c1);
    DictionaryContext::WriteKey(pDVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    DictionaryContext::WriteNewObjectReferenceValue(local_a0,inObjectReference);
    ObjectsContext::EndDictionary(pOStack_90,local_a0);
    ObjectsContext::EndIndirectObject(pOStack_90);
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start modified page object\n");
  }
  EVar2 = modifiedPageObject._4_4_;
  modifiedPageObject._0_4_ = 1;
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)
             &pageDictionaryObjectIt.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition);
  return EVar2;
}

Assistant:

static EStatusCode AddPageToNewTree(unsigned long inPageIndex, PDFWriter& inWriter, PDFDocumentCopyingContext* inCopyingContext) {
	CatalogInformation& catalogInformation = inWriter.GetDocumentContext().GetCatalogInformation();
	IndirectObjectsReferenceRegistry& objectsRegistry = inWriter.GetObjectsContext().GetInDirectObjectsRegistry();
	PDFParser& modifiedFileParser = inWriter.GetModifiedFileParser();

	ObjectIDType pageObjectId = modifiedFileParser.GetPageObjectID(inPageIndex);

	// re-add the page to the new page tree
	ObjectIDType newParent =  catalogInformation.AddPageToPageTree(pageObjectId, objectsRegistry);

	// now modify the page object to refer to the new parent
	PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = modifiedFileParser.ParsePage(inPageIndex);
	MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();
	ObjectsContext& objectContext = inWriter.GetObjectsContext();


	EStatusCode status = objectContext.StartModifiedIndirectObject(pageObjectId);
	if(status != eSuccess) {
		cout<<"failed to start modified page object\n";
		return status;
	}
	DictionaryContext* modifiedPageObject = objectContext.StartDictionary();

	// copy all elements of the page to the new page object, but the "Parent" element
	while (pageDictionaryObjectIt.MoveNext())
	{
		if (pageDictionaryObjectIt.GetKey()->GetValue() != "Parent")
		{
			modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
			inCopyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
		}
	}

	// now add parent entry
	modifiedPageObject->WriteKey("Parent");
	modifiedPageObject->WriteNewObjectReferenceValue(newParent);

	objectContext.EndDictionary(modifiedPageObject);
	objectContext.EndIndirectObject();

	return status;

}